

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::createwallet(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_03;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_ffffffffffffe108;
  uint uVar2;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffe110;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe140;
  UniValue *in_stack_ffffffffffffe148;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *in_stack_ffffffffffffe150;
  undefined7 in_stack_ffffffffffffe158;
  undefined1 in_stack_ffffffffffffe15f;
  string *in_stack_ffffffffffffe160;
  undefined7 in_stack_ffffffffffffe168;
  undefined1 in_stack_ffffffffffffe16f;
  undefined4 in_stack_ffffffffffffe170;
  Type in_stack_ffffffffffffe174;
  string *in_stack_ffffffffffffe178;
  undefined4 in_stack_ffffffffffffe180;
  Type in_stack_ffffffffffffe184;
  undefined4 in_stack_ffffffffffffe188;
  Type in_stack_ffffffffffffe18c;
  RPCResult *in_stack_ffffffffffffe190;
  undefined1 *local_1e10;
  undefined1 *local_1df8;
  undefined1 *local_1de0;
  undefined1 *local_1dc8;
  RPCExamples *in_stack_ffffffffffffe250;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *fun;
  undefined1 local_1b70 [37];
  undefined1 local_1b4b;
  undefined1 local_1b4a;
  undefined1 local_1b49;
  undefined1 local_1b2d [30];
  undefined1 local_1b0f [2];
  allocator<char> local_1b0d;
  allocator<char> local_1b0c;
  allocator<char> local_1b0b [33];
  allocator<char> local_1aea;
  allocator<char> local_1ae9 [31];
  allocator<char> local_1aca;
  allocator<char> local_1ac9;
  size_type local_1ac8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1ac0;
  allocator<char> local_1aa2;
  allocator<char> local_1aa1 [31];
  allocator<char> local_1a82;
  allocator<char> local_1a81 [29];
  allocator<char> local_1a64 [2];
  allocator<char> local_1a62;
  allocator<char> local_1a61;
  undefined4 local_1a60;
  allocator<char> local_1a5c;
  allocator<char> local_1a5b;
  undefined1 local_1a5a;
  allocator<char> local_1a59;
  allocator<char> local_1a58;
  undefined1 local_1a57;
  allocator<char> local_1a56;
  undefined1 local_1a55 [6];
  allocator<char> local_1a4f [2];
  allocator<char> local_1a4d;
  allocator<char> local_1a4c [2];
  allocator<char> local_1a4a;
  allocator<char> local_1a49;
  undefined4 local_1a48;
  allocator<char> local_1a41 [31];
  allocator<char> local_1a22;
  allocator<char> local_1a21;
  undefined1 local_1a20 [480];
  undefined1 local_1840 [64];
  undefined1 local_1800 [480];
  undefined1 local_1620 [448];
  undefined1 local_1460 [136];
  undefined1 local_13d8 [128];
  undefined1 local_1358 [272];
  undefined1 local_1248 [200];
  undefined1 local_1180;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined1 local_1140;
  undefined1 local_113f;
  undefined1 local_1040;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  ulong local_1000;
  undefined1 local_f58;
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined1 local_f18;
  undefined1 local_f17;
  undefined1 local_e18;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined1 local_dd8;
  undefined1 local_dd7;
  undefined1 local_cd8;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined1 local_c98;
  undefined1 local_c97;
  undefined1 local_bf0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined1 local_bb0;
  undefined1 local_baf;
  undefined1 local_ab0;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined1 local_a70;
  undefined1 local_a6f;
  undefined1 local_970;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined1 local_930;
  undefined1 local_92f;
  undefined1 local_888 [2112];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1a48 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe118,&in_stack_ffffffffffffe110->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_970 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe120);
  local_948 = 0;
  uStack_940 = 0;
  local_938 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe108);
  local_930 = 0;
  local_92f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
                 in_stack_ffffffffffffe178,in_stack_ffffffffffffe174,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe16f,in_stack_ffffffffffffe168),
                 in_stack_ffffffffffffe160,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1a4c[1] = (allocator<char>)0x0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe148,(bool *)in_stack_ffffffffffffe140);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_ab0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe120);
  local_a88 = 0;
  uStack_a80 = 0;
  local_a78 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe108);
  local_a70 = 0;
  local_a6f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
                 in_stack_ffffffffffffe178,in_stack_ffffffffffffe174,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe16f,in_stack_ffffffffffffe168),
                 in_stack_ffffffffffffe160,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1a4f[1] = (allocator<char>)0x0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe148,(bool *)in_stack_ffffffffffffe140);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_bf0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe120);
  local_bc8 = 0;
  uStack_bc0 = 0;
  local_bb8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe108);
  local_bb0 = 0;
  local_baf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
                 in_stack_ffffffffffffe178,in_stack_ffffffffffffe174,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe16f,in_stack_ffffffffffffe168),
                 in_stack_ffffffffffffe160,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1a55._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe118,&in_stack_ffffffffffffe110->typ);
  fun = (RPCMethodImpl *)local_1a55;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_cd8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe120);
  local_cb0 = 0;
  uStack_ca8 = 0;
  local_ca0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe108);
  local_c98 = 0;
  local_c97 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
                 in_stack_ffffffffffffe178,in_stack_ffffffffffffe174,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe16f,in_stack_ffffffffffffe168),
                 in_stack_ffffffffffffe160,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1a57 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe148,(bool *)in_stack_ffffffffffffe140);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_e18 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe120);
  local_df0 = 0;
  uStack_de8 = 0;
  local_de0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe108);
  local_dd8 = 0;
  local_dd7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
                 in_stack_ffffffffffffe178,in_stack_ffffffffffffe174,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe16f,in_stack_ffffffffffffe168),
                 in_stack_ffffffffffffe160,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1a5a = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe148,(bool *)in_stack_ffffffffffffe140);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_f58 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe120);
  local_f30 = 0;
  uStack_f28 = 0;
  local_f20 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe108);
  local_f18 = 0;
  local_f17 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
                 in_stack_ffffffffffffe178,in_stack_ffffffffffffe174,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe16f,in_stack_ffffffffffffe168),
                 in_stack_ffffffffffffe160,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1a60 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe118,&in_stack_ffffffffffffe110->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1040 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe120);
  local_1018 = 0;
  uStack_1010 = 0;
  local_1008 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe108);
  local_1000 = local_1000 & 0xffffffffffff0000;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
                 in_stack_ffffffffffffe178,in_stack_ffffffffffffe174,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe16f,in_stack_ffffffffffffe168),
                 in_stack_ffffffffffffe160,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1a64[1] = (allocator<char>)0x0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe148,(bool *)in_stack_ffffffffffffe140);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe118,in_stack_ffffffffffffe110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1180 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe120);
  local_1158 = 0;
  uStack_1150 = 0;
  local_1148 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe108);
  local_1140 = 0;
  local_113f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
                 in_stack_ffffffffffffe178,in_stack_ffffffffffffe174,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe16f,in_stack_ffffffffffffe168),
                 in_stack_ffffffffffffe160,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158));
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_ffffffffffffe108);
  __l._M_len._0_7_ = in_stack_ffffffffffffe158;
  __l._M_array = (iterator)in_stack_ffffffffffffe150;
  __l._M_len._7_1_ = in_stack_ffffffffffffe15f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe148,__l,
             (allocator_type *)in_stack_ffffffffffffe140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1ac8 = 0;
  aStack_1ac0._M_allocated_capacity = 0;
  aStack_1ac0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe108);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe190,in_stack_ffffffffffffe18c,
             (string *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             in_stack_ffffffffffffe178,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe174,in_stack_ffffffffffffe170),
             (bool)in_stack_ffffffffffffe16f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  local_1b0b._3_8_ = 0;
  local_1b0b._11_8_ = 0;
  local_1b0b[0x13] = (allocator<char>)0x0;
  local_1b0b[0x14] = (allocator<char>)0x0;
  local_1b0b[0x15] = (allocator<char>)0x0;
  local_1b0b[0x16] = (allocator<char>)0x0;
  local_1b0b[0x17] = (allocator<char>)0x0;
  local_1b0b[0x18] = (allocator<char>)0x0;
  local_1b0b[0x19] = (allocator<char>)0x0;
  local_1b0b[0x1a] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe108);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe190,in_stack_ffffffffffffe18c,
             (string *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             in_stack_ffffffffffffe178,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe174,in_stack_ffffffffffffe170),
             (bool)in_stack_ffffffffffffe16f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe108);
  uVar2 = (uint)((ulong)in_stack_ffffffffffffe108 >> 0x20);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe158;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe150;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe15f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe148,__l_00,
             (allocator_type *)in_stack_ffffffffffffe140);
  this = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
          *)((ulong)uVar2 << 0x20);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe18c,in_stack_ffffffffffffe188),
             in_stack_ffffffffffffe184,in_stack_ffffffffffffe178,
             SUB41(in_stack_ffffffffffffe174 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe16f,in_stack_ffffffffffffe168),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe160,
             (bool)in_stack_ffffffffffffe15f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe158;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe150;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe15f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe148,__l_01,
             (allocator_type *)in_stack_ffffffffffffe140);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe190,in_stack_ffffffffffffe18c,
             (string *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180),
             in_stack_ffffffffffffe178,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe174,in_stack_ffffffffffffe170),
             (bool)in_stack_ffffffffffffe16f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe18c,in_stack_ffffffffffffe188),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe184,in_stack_ffffffffffffe180));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  HelpExampleCli(in_stack_ffffffffffffe140,in_stack_ffffffffffffe138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  HelpExampleRpc(in_stack_ffffffffffffe140,in_stack_ffffffffffffe138);
  std::operator+(in_stack_ffffffffffffe140,in_stack_ffffffffffffe138);
  this_01 = (RPCHelpMan *)local_1b0f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[12],_true>
            (in_stack_ffffffffffffe150,(char (*) [12])in_stack_ffffffffffffe148,
             (char (*) [12])in_stack_ffffffffffffe140);
  local_1b2d[4] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_bool,_true>
            (in_stack_ffffffffffffe150,(char (*) [12])in_stack_ffffffffffffe148,
             (bool *)in_stack_ffffffffffffe140);
  local_1b2d[3] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_bool,_true>
            (in_stack_ffffffffffffe150,(char (*) [12])in_stack_ffffffffffffe148,
             (bool *)in_stack_ffffffffffffe140);
  local_1b2d[2] = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[16],_bool,_true>
            (in_stack_ffffffffffffe150,(char (*) [16])in_stack_ffffffffffffe148,
             (bool *)in_stack_ffffffffffffe140);
  name = (string *)(local_1b2d + 1);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::allocator(this);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe158;
  __l_02._M_array = in_stack_ffffffffffffe150;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe15f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)in_stack_ffffffffffffe148,__l_02,(allocator_type *)in_stack_ffffffffffffe140);
  HelpExampleCliNamed(in_stack_ffffffffffffe160,
                      (RPCArgList *)CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158));
  std::operator+(in_stack_ffffffffffffe140,in_stack_ffffffffffffe138);
  description = (string *)local_1b2d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe15f,in_stack_ffffffffffffe158),
             (char *)in_stack_ffffffffffffe150,(allocator<char> *)in_stack_ffffffffffffe148);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[12],_true>
            (in_stack_ffffffffffffe150,(char (*) [12])in_stack_ffffffffffffe148,
             (char (*) [12])in_stack_ffffffffffffe140);
  local_1b49 = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_bool,_true>
            (in_stack_ffffffffffffe150,(char (*) [12])in_stack_ffffffffffffe148,
             (bool *)in_stack_ffffffffffffe140);
  local_1b4a = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_bool,_true>
            (in_stack_ffffffffffffe150,(char (*) [12])in_stack_ffffffffffffe148,
             (bool *)in_stack_ffffffffffffe140);
  local_1b4b = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[16],_bool,_true>
            (in_stack_ffffffffffffe150,(char (*) [16])in_stack_ffffffffffffe148,
             (bool *)in_stack_ffffffffffffe140);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)(local_1b70 + 0x24);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::allocator(this);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffe158;
  __l_03._M_array = in_stack_ffffffffffffe150;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffe15f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)in_stack_ffffffffffffe148,__l_03,(allocator_type *)in_stack_ffffffffffffe140);
  HelpExampleRpcNamed(&in_stack_ffffffffffffe150->first,(RPCArgList *)in_stack_ffffffffffffe148);
  std::operator+(in_stack_ffffffffffffe140,in_stack_ffffffffffffe138);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x9d9597);
  this_00 = (RPCArg *)local_1b70;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::createwallet()::__0,void>
            (in_stack_ffffffffffffe118,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe110);
  RPCHelpMan::RPCHelpMan
            (this_01,name,description,args,(RPCResults *)this_00,in_stack_ffffffffffffe250,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)in_stack_ffffffffffffe118);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                *)this_00);
  puVar1 = local_1840;
  do {
    puVar1 = puVar1 + -0x78;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)this_00);
  } while (puVar1 != local_1a20);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1b2d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)in_stack_ffffffffffffe118);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                *)this_00);
  local_1dc8 = local_1620;
  do {
    local_1dc8 = local_1dc8 + -0x78;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)this_00);
  } while (local_1dc8 != local_1800);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1b0f);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1b0f + 1));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1b0d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1b0c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1b0b);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe118);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1de0 = local_1248;
  do {
    local_1de0 = local_1de0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1de0 != local_1358);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe118);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_1df8 = local_13d8;
  do {
    local_1df8 = local_1df8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_1df8 != local_1460);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe118);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1aea);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1ae9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1aca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1ac9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe118);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1aa2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1aa1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a82);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1a81);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe118);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_1e10 = local_48;
  do {
    local_1e10 = local_1e10 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_1e10 != local_888);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1a64);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a62);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a61);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a5c);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a5b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a59);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a58);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a56);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1a55);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1a55 + 5));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1a4f);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a4d);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1a4c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a4a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a49);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1a41);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a22);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1a21);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan createwallet()
{
    return RPCHelpMan{
        "createwallet",
        "\nCreates and loads a new wallet.\n",
        {
            {"wallet_name", RPCArg::Type::STR, RPCArg::Optional::NO, "The name for the new wallet. If this is a path, the wallet will be created at the path location."},
            {"disable_private_keys", RPCArg::Type::BOOL, RPCArg::Default{false}, "Disable the possibility of private keys (only watchonlys are possible in this mode)."},
            {"blank", RPCArg::Type::BOOL, RPCArg::Default{false}, "Create a blank wallet. A blank wallet has no keys or HD seed. One can be set using sethdseed."},
            {"passphrase", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Encrypt the wallet with this passphrase."},
            {"avoid_reuse", RPCArg::Type::BOOL, RPCArg::Default{false}, "Keep track of coin reuse, and treat dirty and clean coins differently with privacy considerations in mind."},
            {"descriptors", RPCArg::Type::BOOL, RPCArg::Default{true}, "Create a native descriptor wallet. The wallet will use descriptors internally to handle address creation."
                                                                       " Setting to \"false\" will create a legacy wallet; This is only possible with the -deprecatedrpc=create_bdb setting because, the legacy wallet type is being deprecated and"
                                                                       " support for creating and opening legacy wallets will be removed in the future."},
            {"load_on_startup", RPCArg::Type::BOOL, RPCArg::Optional::OMITTED, "Save wallet name to persistent settings and load on startup. True to add wallet to startup list, false to remove, null to leave unchanged."},
            {"external_signer", RPCArg::Type::BOOL, RPCArg::Default{false}, "Use an external signer such as a hardware wallet. Requires -signer to be configured. Wallet creation will fail if keys cannot be fetched. Requires disable_private_keys and descriptors set to true."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "name", "The wallet name if created successfully. If the wallet was created using a full path, the wallet_name will be the full path."},
                {RPCResult::Type::ARR, "warnings", /*optional=*/true, "Warning messages, if any, related to creating and loading the wallet.",
                {
                    {RPCResult::Type::STR, "", ""},
                }},
            }
        },
        RPCExamples{
            HelpExampleCli("createwallet", "\"testwallet\"")
            + HelpExampleRpc("createwallet", "\"testwallet\"")
            + HelpExampleCliNamed("createwallet", {{"wallet_name", "descriptors"}, {"avoid_reuse", true}, {"descriptors", true}, {"load_on_startup", true}})
            + HelpExampleRpcNamed("createwallet", {{"wallet_name", "descriptors"}, {"avoid_reuse", true}, {"descriptors", true}, {"load_on_startup", true}})
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    WalletContext& context = EnsureWalletContext(request.context);
    uint64_t flags = 0;
    if (!request.params[1].isNull() && request.params[1].get_bool()) {
        flags |= WALLET_FLAG_DISABLE_PRIVATE_KEYS;
    }

    if (!request.params[2].isNull() && request.params[2].get_bool()) {
        flags |= WALLET_FLAG_BLANK_WALLET;
    }
    SecureString passphrase;
    passphrase.reserve(100);
    std::vector<bilingual_str> warnings;
    if (!request.params[3].isNull()) {
        passphrase = std::string_view{request.params[3].get_str()};
        if (passphrase.empty()) {
            // Empty string means unencrypted
            warnings.emplace_back(Untranslated("Empty string given as passphrase, wallet will not be encrypted."));
        }
    }

    if (!request.params[4].isNull() && request.params[4].get_bool()) {
        flags |= WALLET_FLAG_AVOID_REUSE;
    }
    if (self.Arg<bool>("descriptors")) {
#ifndef USE_SQLITE
        throw JSONRPCError(RPC_WALLET_ERROR, "Compiled without sqlite support (required for descriptor wallets)");
#endif
        flags |= WALLET_FLAG_DESCRIPTORS;
    } else {
        if (!context.chain->rpcEnableDeprecated("create_bdb")) {
            throw JSONRPCError(RPC_WALLET_ERROR, "BDB wallet creation is deprecated and will be removed in a future release."
                                                 " In this release it can be re-enabled temporarily with the -deprecatedrpc=create_bdb setting.");
        }
    }
    if (!request.params[7].isNull() && request.params[7].get_bool()) {
#ifdef ENABLE_EXTERNAL_SIGNER
        flags |= WALLET_FLAG_EXTERNAL_SIGNER;
#else
        throw JSONRPCError(RPC_WALLET_ERROR, "Compiled without external signing support (required for external signing)");
#endif
    }

#ifndef USE_BDB
    if (!(flags & WALLET_FLAG_DESCRIPTORS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Compiled without bdb support (required for legacy wallets)");
    }
#endif

    DatabaseOptions options;
    DatabaseStatus status;
    ReadDatabaseArgs(*context.args, options);
    options.require_create = true;
    options.create_flags = flags;
    options.create_passphrase = passphrase;
    bilingual_str error;
    std::optional<bool> load_on_start = request.params[6].isNull() ? std::nullopt : std::optional<bool>(request.params[6].get_bool());
    const std::shared_ptr<CWallet> wallet = CreateWallet(context, request.params[0].get_str(), load_on_start, options, status, error, warnings);
    if (!wallet) {
        RPCErrorCode code = status == DatabaseStatus::FAILED_ENCRYPT ? RPC_WALLET_ENCRYPTION_FAILED : RPC_WALLET_ERROR;
        throw JSONRPCError(code, error.original);
    }

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("name", wallet->GetName());
    PushWarnings(warnings, obj);

    return obj;
},
    };
}